

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O1

string * __thiscall
Lodtalk::Class::getNameString_abi_cxx11_(string *__return_storage_ptr__,Class *this)

{
  ObjectHeader *this_00;
  char *pcVar1;
  char *pcVar2;
  
  this_00 = (this->name).field_0.header;
  if (this_00 == (ObjectHeader *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "uninitialized";
    pcVar1 = "";
  }
  else {
    if (this_00 != (ObjectHeader *)&NilObject) {
      ByteSymbol::getString_abi_cxx11_(__return_storage_ptr__,(ByteSymbol *)this_00);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "UnknownClass";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Class::getNameString()
{
	if(!name.pointer)
		return "uninitialized";
	if(name.isNil())
		return "UnknownClass";

	ByteSymbol *nameSymbol = reinterpret_cast<ByteSymbol *> (name.pointer);
	return nameSymbol->getString();
}